

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmCommonTargetGenerator::cmCommonTargetGenerator
          (cmCommonTargetGenerator *this,RelativeRoot wd,cmGeneratorTarget *gt)

{
  cmGlobalGenerator *pcVar1;
  string *psVar2;
  cmSourceFile *pcVar3;
  cmGeneratorTarget *gt_local;
  RelativeRoot wd_local;
  cmCommonTargetGenerator *this_local;
  
  this->_vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmCommonTargetGenerator_00b1d7b8;
  this->WorkingDirectory = wd;
  this->GeneratorTarget = gt;
  this->Makefile = gt->Makefile;
  this->LocalGenerator = (cmLocalCommonGenerator *)gt->LocalGenerator;
  pcVar1 = cmLocalGenerator::GetGlobalGenerator(gt->LocalGenerator);
  this->GlobalGenerator = (cmGlobalCommonGenerator *)pcVar1;
  psVar2 = cmLocalCommonGenerator::GetConfigName_abi_cxx11_(this->LocalGenerator);
  std::__cxx11::string::string((string *)&this->ConfigName,(string *)psVar2);
  pcVar3 = cmGeneratorTarget::GetModuleDefinitionFile(this->GeneratorTarget,&this->ConfigName);
  this->ModuleDefinitionFile = pcVar3;
  this->FortranModuleDirectoryComputed = false;
  std::__cxx11::string::string((string *)&this->FortranModuleDirectory);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->FlagsByLanguage);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->DefinesByLanguage);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->IncludesByLanguage);
  return;
}

Assistant:

cmCommonTargetGenerator::cmCommonTargetGenerator(
  cmOutputConverter::RelativeRoot wd,
  cmGeneratorTarget* gt
  )
  : WorkingDirectory(wd)
  , GeneratorTarget(gt)
  , Makefile(gt->Makefile)
  , LocalGenerator(static_cast<cmLocalCommonGenerator*>(gt->LocalGenerator))
  , GlobalGenerator(static_cast<cmGlobalCommonGenerator*>(
                      gt->LocalGenerator->GetGlobalGenerator()))
  , ConfigName(LocalGenerator->GetConfigName())
  , ModuleDefinitionFile(GeneratorTarget->GetModuleDefinitionFile(ConfigName))
  , FortranModuleDirectoryComputed(false)
{
}